

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darBalance.c
# Opt level: O2

Aig_Man_t * Dar_ManBalance(Aig_Man_t *p,int fUpdateLevel)

{
  Vec_Int_t *pVVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  Aig_Man_t *pNew;
  char *pcVar6;
  Vec_Int_t *pVVar7;
  int *__dest;
  Vec_Vec_t *vStore;
  void **ppvVar8;
  Aig_Obj_t *pAVar9;
  Aig_Obj_t *pAVar10;
  Aig_Obj_t *pAVar11;
  Tim_Man_t *pTVar12;
  void *pvVar13;
  Vec_Ptr_t *p_00;
  Vec_Ptr_t *p_01;
  size_t __size;
  int iVar14;
  float fVar15;
  
  iVar3 = Aig_ManVerifyTopoOrder(p);
  if (iVar3 == 0) {
    __assert_fail("Aig_ManVerifyTopoOrder(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dar/darBalance.c"
                  ,0x230,"Aig_Man_t *Dar_ManBalance(Aig_Man_t *, int)");
  }
  pNew = Aig_ManStart(p->vObjs->nSize);
  pcVar6 = Abc_UtilStrsav(p->pName);
  pNew->pName = pcVar6;
  pcVar6 = Abc_UtilStrsav(p->pSpec);
  pNew->pSpec = pcVar6;
  iVar3 = p->nConstrs;
  pNew->nAsserts = p->nAsserts;
  pNew->nConstrs = iVar3;
  pNew->nBarBufs = p->nBarBufs;
  pNew->Time2Quit = p->Time2Quit;
  pVVar1 = p->vFlopNums;
  if (pVVar1 != (Vec_Int_t *)0x0) {
    pVVar7 = (Vec_Int_t *)malloc(0x10);
    iVar3 = pVVar1->nSize;
    pVVar7->nSize = iVar3;
    pVVar7->nCap = iVar3;
    if ((long)iVar3 == 0) {
      __size = 0;
      __dest = (int *)0x0;
    }
    else {
      __size = (long)iVar3 << 2;
      __dest = (int *)malloc(__size);
    }
    pVVar7->pArray = __dest;
    memcpy(__dest,pVVar1->pArray,__size);
    pNew->vFlopNums = pVVar7;
  }
  Aig_ManCleanData(p);
  p->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)pNew->pConst1;
  vStore = (Vec_Vec_t *)malloc(0x10);
  vStore->nCap = 0x32;
  vStore->nSize = 0;
  ppvVar8 = (void **)malloc(400);
  vStore->pArray = ppvVar8;
  if ((Tim_Man_t *)p->pManTime == (Tim_Man_t *)0x0) {
    for (iVar3 = 0; iVar3 < p->vCis->nSize; iVar3 = iVar3 + 1) {
      pvVar13 = Vec_PtrEntry(p->vCis,iVar3);
      pAVar9 = Aig_ObjCreateCi(pNew);
      *(ulong *)&pAVar9->field_0x18 =
           *(ulong *)&pAVar9->field_0x18 & 0xff000000ffffffff |
           *(ulong *)((long)pvVar13 + 0x18) & 0xffffff00000000;
      *(Aig_Obj_t **)((long)pvVar13 + 0x28) = pAVar9;
    }
    if (p->nBarBufs == 0) {
      for (iVar3 = 0; iVar3 < p->vCos->nSize; iVar3 = iVar3 + 1) {
        pvVar13 = Vec_PtrEntry(p->vCos,iVar3);
        pAVar9 = Aig_ObjReal_rec(*(Aig_Obj_t **)((long)pvVar13 + 8));
        pAVar10 = Dar_Balance_rec(pNew,(Aig_Obj_t *)((ulong)pAVar9 & 0xfffffffffffffffe),vStore,0,
                                  fUpdateLevel);
        if (pAVar10 == (Aig_Obj_t *)0x0) goto LAB_0042483a;
        Aig_ObjCreateCo(pNew,(Aig_Obj_t *)((ulong)((uint)pAVar9 & 1) ^ (ulong)pAVar10));
      }
    }
    else {
      iVar3 = p->nObjs[3];
      p_00 = Vec_PtrAlloc(iVar3);
      p_00->nSize = iVar3;
      iVar4 = 0;
      memset(p_00->pArray,0,(long)iVar3 << 3);
      while( true ) {
        p_01 = p->vCos;
        iVar3 = p_01->nSize;
        if (iVar3 <= iVar4) break;
        Vec_PtrEntry(p_01,iVar4);
        iVar3 = p->nBarBufs;
        iVar14 = -iVar3;
        if (iVar4 < iVar3) {
          iVar14 = p->nObjs[3] - iVar3;
        }
        pvVar13 = Vec_PtrEntry(p->vCos,iVar4 + iVar14);
        pAVar9 = Aig_ObjReal_rec(*(Aig_Obj_t **)((long)pvVar13 + 8));
        pAVar10 = Dar_Balance_rec(pNew,(Aig_Obj_t *)((ulong)pAVar9 & 0xfffffffffffffffe),vStore,0,
                                  fUpdateLevel);
        if (pAVar10 == (Aig_Obj_t *)0x0) {
          Vec_VecFree(vStore);
          goto LAB_00424847;
        }
        Vec_PtrWriteEntry(p_00,iVar4 + iVar14,(void *)((ulong)((uint)pAVar9 & 1) ^ (ulong)pAVar10));
        if (iVar4 < p->nBarBufs) {
          uVar2 = *(ulong *)(((ulong)pAVar10 & 0xfffffffffffffffe) + 0x18);
          pvVar13 = Vec_PtrEntry(pNew->vCis,(p->nObjs[2] - p->nBarBufs) + iVar4);
          *(ulong *)((long)pvVar13 + 0x18) =
               *(ulong *)((long)pvVar13 + 0x18) & 0xff000000ffffffff | uVar2 & 0xffffff00000000;
        }
        iVar4 = iVar4 + 1;
      }
      for (iVar4 = 0; iVar4 < iVar3; iVar4 = iVar4 + 1) {
        Vec_PtrEntry(p_01,iVar4);
        pAVar9 = (Aig_Obj_t *)Vec_PtrEntry(p_00,iVar4);
        Aig_ObjCreateCo(pNew,pAVar9);
        p_01 = p->vCos;
        iVar3 = p_01->nSize;
      }
      Vec_PtrFree(p_00);
    }
  }
  else {
    Tim_ManIncrementTravId((Tim_Man_t *)p->pManTime);
    Aig_ManSetCioIds(p);
    for (iVar3 = 0; iVar3 < p->vObjs->nSize; iVar3 = iVar3 + 1) {
      pAVar9 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,iVar3);
      if (((pAVar9 != (Aig_Obj_t *)0x0) && ((*(uint *)&pAVar9->field_0x18 & 7) - 7 < 0xfffffffe)) &&
         (iVar4 = Aig_ObjIsConst1(pAVar9), iVar4 == 0)) {
        uVar5 = (uint)*(undefined8 *)&pAVar9->field_0x18 & 7;
        if (uVar5 == 3) {
          pAVar10 = Aig_ObjReal_rec(pAVar9->pFanin0);
          pAVar11 = Dar_Balance_rec(pNew,(Aig_Obj_t *)((ulong)pAVar10 & 0xfffffffffffffffe),vStore,0
                                    ,fUpdateLevel);
          if (pAVar11 == (Aig_Obj_t *)0x0) {
LAB_0042483a:
            Vec_VecFree(vStore);
LAB_00424847:
            Aig_ManStop(pNew);
            return (Aig_Man_t *)0x0;
          }
          uVar5 = *(uint *)(((ulong)pAVar11 & 0xfffffffffffffffe) + 0x1c);
          pTVar12 = (Tim_Man_t *)p->pManTime;
          iVar4 = Aig_ObjCioId(pAVar9);
          Tim_ManSetCoArrival(pTVar12,iVar4,(float)(uVar5 & 0xffffff));
          Aig_ObjCreateCo(pNew,(Aig_Obj_t *)((ulong)((uint)pAVar10 & 1) ^ (ulong)pAVar11));
        }
        else {
          if (uVar5 != 2) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dar/darBalance.c"
                          ,0x264,"Aig_Man_t *Dar_ManBalance(Aig_Man_t *, int)");
          }
          pAVar10 = Aig_ObjCreateCi(pNew);
          (pAVar9->field_5).pData = pAVar10;
          pTVar12 = (Tim_Man_t *)p->pManTime;
          iVar4 = Aig_ObjCioId(pAVar9);
          fVar15 = Tim_ManGetCiArrival(pTVar12,iVar4);
          *(ulong *)&pAVar10->field_0x18 =
               *(ulong *)&pAVar10->field_0x18 & 0xff000000ffffffff |
               (ulong)((int)fVar15 & 0xffffff) << 0x20;
        }
      }
    }
    Aig_ManCleanCioIds(p);
    pTVar12 = Tim_ManDup((Tim_Man_t *)p->pManTime,0);
    pNew->pManTime = pTVar12;
  }
  Vec_VecFree(vStore);
  Aig_ManCleanup(pNew);
  Aig_ManSetRegNum(pNew,p->nRegs);
  iVar3 = Aig_ManCheck(pNew);
  if (iVar3 == 0) {
    puts("Dar_ManBalance(): The check has failed.");
  }
  return pNew;
}

Assistant:

Aig_Man_t * Dar_ManBalance( Aig_Man_t * p, int fUpdateLevel )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj, * pDriver, * pObjNew;
    Vec_Vec_t * vStore;
    int i;
    assert( Aig_ManVerifyTopoOrder(p) );
    // create the new manager 
    pNew = Aig_ManStart( Aig_ManObjNumMax(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    pNew->nAsserts = p->nAsserts;
    pNew->nConstrs = p->nConstrs;
    pNew->nBarBufs = p->nBarBufs;
    pNew->Time2Quit = p->Time2Quit;
    if ( p->vFlopNums )
        pNew->vFlopNums = Vec_IntDup( p->vFlopNums );
    // map the PI nodes
    Aig_ManCleanData( p );
    Aig_ManConst1(p)->pData = Aig_ManConst1(pNew);
    vStore = Vec_VecAlloc( 50 );
    if ( p->pManTime != NULL )
    {
        float arrTime;
        Tim_ManIncrementTravId( (Tim_Man_t *)p->pManTime );
        Aig_ManSetCioIds( p );
        Aig_ManForEachObj( p, pObj, i )
        {
            if ( Aig_ObjIsNode(pObj) || Aig_ObjIsConst1(pObj) )
                continue;
            if ( Aig_ObjIsCi(pObj) )
            {
                // copy the PI
                pObjNew = Aig_ObjCreateCi(pNew); 
                pObj->pData = pObjNew;
                // set the arrival time of the new PI
                arrTime = Tim_ManGetCiArrival( (Tim_Man_t *)p->pManTime, Aig_ObjCioId(pObj) );
                pObjNew->Level = (int)arrTime;
            }
            else if ( Aig_ObjIsCo(pObj) )
            {
                // perform balancing
                pDriver = Aig_ObjReal_rec( Aig_ObjChild0(pObj) );
                pObjNew = Dar_Balance_rec( pNew, Aig_Regular(pDriver), vStore, 0, fUpdateLevel );
                if ( pObjNew == NULL )
                {
                    Vec_VecFree( vStore );
                    Aig_ManStop( pNew );
                    return NULL;
                }
                pObjNew = Aig_NotCond( pObjNew, Aig_IsComplement(pDriver) );
                // save arrival time of the output
                arrTime = (float)Aig_Regular(pObjNew)->Level;
                Tim_ManSetCoArrival( (Tim_Man_t *)p->pManTime, Aig_ObjCioId(pObj), arrTime );
                // create PO
                pObjNew = Aig_ObjCreateCo( pNew, pObjNew );
            }
            else
                assert( 0 );
        }
        Aig_ManCleanCioIds( p );
        pNew->pManTime = Tim_ManDup( (Tim_Man_t *)p->pManTime, 0 );
    }
    else
    {
        Aig_ManForEachCi( p, pObj, i )
        {
            pObjNew = Aig_ObjCreateCi(pNew); 
            pObjNew->Level = pObj->Level;
            pObj->pData = pObjNew;
        }
        if ( p->nBarBufs == 0 )
        {
            Aig_ManForEachCo( p, pObj, i )
            {
                pDriver = Aig_ObjReal_rec( Aig_ObjChild0(pObj) );
                pObjNew = Dar_Balance_rec( pNew, Aig_Regular(pDriver), vStore, 0, fUpdateLevel );
                if ( pObjNew == NULL )
                {
                    Vec_VecFree( vStore );
                    Aig_ManStop( pNew );
                    return NULL;
                }
                pObjNew = Aig_NotCond( pObjNew, Aig_IsComplement(pDriver) );
                pObjNew = Aig_ObjCreateCo( pNew, pObjNew );
            }
        }
        else
        {
            Vec_Ptr_t * vLits = Vec_PtrStart( Aig_ManCoNum(p) );
            Aig_ManForEachCo( p, pObj, i )
            {
                int k = i < p->nBarBufs ? Aig_ManCoNum(p) - p->nBarBufs + i : i - p->nBarBufs;
                pObj = Aig_ManCo( p, k );
                pDriver = Aig_ObjReal_rec( Aig_ObjChild0(pObj) );
                pObjNew = Dar_Balance_rec( pNew, Aig_Regular(pDriver), vStore, 0, fUpdateLevel );
                if ( pObjNew == NULL )
                {
                    Vec_VecFree( vStore );
                    Aig_ManStop( pNew );
                    return NULL;
                }
                pObjNew = Aig_NotCond( pObjNew, Aig_IsComplement(pDriver) );
                Vec_PtrWriteEntry( vLits, k, pObjNew );
                if ( i < p->nBarBufs )
                    Aig_ManCi(pNew, Aig_ManCiNum(p) - p->nBarBufs + i)->Level = Aig_Regular(pObjNew)->Level;
            }
            Aig_ManForEachCo( p, pObj, i )
                Aig_ObjCreateCo( pNew, (Aig_Obj_t *)Vec_PtrEntry(vLits, i) );
            Vec_PtrFree(vLits);
        }
    }
    Vec_VecFree( vStore );
    // remove dangling nodes
    Aig_ManCleanup( pNew );
    Aig_ManSetRegNum( pNew, Aig_ManRegNum(p) );
    // check the resulting AIG
    if ( !Aig_ManCheck(pNew) )
        printf( "Dar_ManBalance(): The check has failed.\n" );
    return pNew;
}